

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_safe_frame.cpp
# Opt level: O1

double __thiscall ON_SafeFrame::TitleFrameXScale(ON_SafeFrame *this)

{
  CImpl *this_00;
  double dVar1;
  ON_XMLVariant local_200;
  ON_XMLVariant local_108;
  
  this_00 = this->m_impl;
  ::ON_XMLVariant::ON_XMLVariant(&local_108,0.8);
  CImpl::GetFrameParameter(&local_200,this_00,L"title-frame",L"x-scale",&local_108);
  dVar1 = ::ON_XMLVariant::AsDouble(&local_200);
  ::ON_XMLVariant::~ON_XMLVariant(&local_200);
  ::ON_XMLVariant::~ON_XMLVariant(&local_108);
  return dVar1;
}

Assistant:

double ON_SafeFrame::TitleFrameXScale(void) const
{
  return m_impl->GetFrameParameter(ON_RDK_SF_TITLE_FRAME, ON_RDK_SFF_XSCALE, 0.8).AsDouble();
}